

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureUnitTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::MultiTexShader::shadeFragments
          (MultiTexShader *this,FragmentPacket *packets,int numPackets,
          FragmentShadingContext *context)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  FragmentShadingContext *context_00;
  FragmentPacket *packet;
  ulong uVar4;
  long lVar5;
  Vector<float,_4> *value;
  int unitNdx;
  long lVar6;
  ulong uVar7;
  VecAccess<float,_4,_2> local_218;
  undefined4 local_208;
  FragmentShadingContext *local_200;
  FragmentPacket *local_1f8;
  VecAccess<float,_4,_2> local_1f0;
  undefined4 local_1e0;
  Vec2 coords2D [4];
  VecAccess<float,_4,_2> local_1b8;
  VecAccess<float,_3,_2> local_1a8;
  Vec3 coords3D [4];
  Vec2 texCoords [4];
  VecAccess<float,_3,_2> local_130;
  undefined4 local_120;
  Vector<float,_4> local_118;
  Vector<float,_4> local_108;
  Vector<float,_4> local_f8;
  Vector<float,_4> local_e8;
  Vec4 texSamples [4];
  Vec4 outColors [4];
  tcu local_50 [16];
  tcu local_40 [16];
  
  uVar7 = 0;
  uVar4 = (ulong)(uint)numPackets;
  if (numPackets < 1) {
    uVar4 = uVar7;
  }
  local_200 = context;
  for (; uVar7 != uVar4; uVar7 = uVar7 + 1) {
    iVar1 = *(int *)&(this->super_ShaderProgram).field_0x154;
    local_1f8 = packets + uVar7;
    tcu::Vector<float,_4>::Vector(outColors,0.0);
    tcu::Vector<float,_4>::Vector(outColors + 1,0.0);
    tcu::Vector<float,_4>::Vector(outColors + 2,0.0);
    tcu::Vector<float,_4>::Vector(outColors + 3,0.0);
    for (lVar6 = 0; lVar6 < *(int *)&(this->super_ShaderProgram).field_0x154; lVar6 = lVar6 + 1) {
      lVar5 = 0;
      do {
        tcu::Vector<float,_4>::Vector((Vector<float,_4> *)((long)texSamples[0].m_data + lVar5));
        packet = local_1f8;
        context_00 = local_200;
        lVar5 = lVar5 + 0x10;
      } while (lVar5 != 0x40);
      rr::readTriangleVarying<float>((rr *)coords2D,local_1f8,local_200,0,0);
      coords3D[0].m_data[2] = 0.0;
      coords3D[1].m_data[0] = 1.4013e-45;
      coords3D[0].m_data._0_8_ = (rr *)coords2D;
      tcu::VecAccess::operator_cast_to_Vector((VecAccess<float,_4,_2> *)coords3D);
      rr::readTriangleVarying<float>((rr *)&local_130,packet,context_00,0,1);
      local_218.m_index[0] = 0;
      local_218.m_index[1] = 1;
      local_218.m_vector = (Vector<float,_4> *)&local_130;
      tcu::VecAccess::operator_cast_to_Vector(&local_218);
      rr::readTriangleVarying<float>((rr *)&local_1a8,packet,context_00,0,2);
      local_1f0.m_index[0] = 0;
      local_1f0.m_index[1] = 1;
      local_1f0.m_vector = (Vector<float,_4> *)&local_1a8;
      tcu::VecAccess::operator_cast_to_Vector(&local_1f0);
      rr::readTriangleVarying<float>((rr *)&local_118,local_1f8,context_00,0,3);
      local_1b8.m_vector = &local_118;
      local_1b8.m_index[0] = 0;
      local_1b8.m_index[1] = 1;
      tcu::VecAccess::operator_cast_to_Vector(&local_1b8);
      local_1b8.m_index[0] = 0x3f800000;
      local_1b8.m_index[1] = 0x3f800000;
      tcu::operator*((tcu *)&local_1a8,
                     (this->m_transformations).
                     super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + lVar6,
                     (Vector<float,_4> *)&local_1b8);
      coords2D[1].m_data[0] = 0.0;
      coords2D[1].m_data[1] = 1.4013e-45;
      coords2D[2].m_data[0] = 2.8026e-45;
      coords2D[0].m_data = (float  [2])&local_1a8;
      tcu::VecAccess::operator_cast_to_Vector((VecAccess *)coords3D);
      local_e8.m_data[2] = 1.0;
      local_e8.m_data[3] = 1.0;
      tcu::operator*((tcu *)&local_118,
                     (this->m_transformations).
                     super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + lVar6,&local_e8);
      local_218.m_index[0] = 0;
      local_218.m_index[1] = 1;
      local_208 = 2;
      local_218.m_vector = &local_118;
      tcu::VecAccess::operator_cast_to_Vector((VecAccess *)(coords3D + 1));
      local_f8.m_data[2] = 1.0;
      local_f8.m_data[3] = 1.0;
      tcu::operator*(local_40,(this->m_transformations).
                              super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + lVar6,&local_f8);
      local_130.m_index[0] = 0;
      local_130.m_index[1] = 1;
      local_120 = 2;
      local_130.m_vector = (Vector<float,_3> *)local_40;
      tcu::VecAccess::operator_cast_to_Vector((VecAccess *)(coords3D + 2));
      local_108.m_data[2] = 1.0;
      local_108.m_data[3] = 1.0;
      tcu::operator*(local_50,(this->m_transformations).
                              super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + lVar6,&local_108);
      local_1f0.m_index[0] = 0;
      local_1f0.m_index[1] = 1;
      local_1e0 = 2;
      local_1f0.m_vector = (Vector<float,_4> *)local_50;
      tcu::VecAccess::operator_cast_to_Vector((VecAccess *)(coords3D + 3));
      local_218.m_vector = (Vector<float,_4> *)coords3D;
      local_218.m_index[0] = 0;
      local_218.m_index[1] = 1;
      tcu::VecAccess::operator_cast_to_Vector((VecAccess<float,_3,_2> *)&local_218);
      local_130.m_vector = coords3D + 1;
      local_130.m_index[0] = 0;
      local_130.m_index[1] = 1;
      tcu::VecAccess::operator_cast_to_Vector(&local_130);
      local_1f0.m_vector = (Vector<float,_4> *)(coords3D + 2);
      local_1f0.m_index[0] = 0;
      local_1f0.m_index[1] = 1;
      tcu::VecAccess::operator_cast_to_Vector((VecAccess<float,_3,_2> *)&local_1f0);
      local_1a8.m_index[0] = 0;
      local_1a8.m_index[1] = 1;
      local_1a8.m_vector = (Vector<float,_3> *)(coords3D + 3);
      tcu::VecAccess::operator_cast_to_Vector(&local_1a8);
      uVar2 = (this->m_unitTypes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar6];
      iVar3 = (int)lVar6;
      if (uVar2 == 0x8c1a) {
        sglr::rc::Texture2DArray::sample4
                  ((this->super_ShaderProgram).m_uniforms.
                   super__Vector_base<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>._M_impl
                   .super__Vector_impl_data._M_start[iVar3 * 4].sampler.tex2DArray,texSamples,
                   coords3D,0.0);
      }
      else if (uVar2 == 0x806f) {
        sglr::rc::Texture3D::sample4
                  ((this->super_ShaderProgram).m_uniforms.
                   super__Vector_base<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>._M_impl
                   .super__Vector_impl_data._M_start[iVar3 * 4].sampler.tex3D,texSamples,coords3D,
                   0.0);
      }
      else if (uVar2 == 0x8513) {
        sglr::rc::TextureCube::sample4
                  ((this->super_ShaderProgram).m_uniforms.
                   super__Vector_base<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>._M_impl
                   .super__Vector_impl_data._M_start[iVar3 * 4].sampler.texCube,texSamples,coords3D,
                   0.0);
      }
      else if (uVar2 == 0xde1) {
        sglr::rc::Texture2D::sample4
                  ((this->super_ShaderProgram).m_uniforms.
                   super__Vector_base<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>._M_impl
                   .super__Vector_impl_data._M_start[iVar3 * 4].sampler.tex2D,texSamples,coords2D,
                   0.0);
      }
      for (lVar5 = 0; lVar5 != 0x40; lVar5 = lVar5 + 0x10) {
        tcu::operator*((tcu *)&local_1f0,(Vector<float,_4> *)((long)texSamples[0].m_data + lVar5),
                       (this->m_texScales).
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar6);
        tcu::operator+((tcu *)&local_130,(Vector<float,_4> *)&local_1f0,
                       (this->m_texBiases).
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar6);
        tcu::operator*((tcu *)&local_218,1.0 / (float)iVar1,(Vector<float,_4> *)&local_130);
        tcu::Vector<float,_4>::operator+=
                  ((Vector<float,_4> *)((long)outColors[0].m_data + lVar5),
                   (Vector<float,_4> *)&local_218);
      }
    }
    value = outColors;
    for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
      rr::writeFragmentOutput<tcu::Vector<float,4>>(local_200,(int)uVar7,(int)lVar6,0,value);
      value = value + 1;
    }
  }
  return;
}

Assistant:

void MultiTexShader::shadeFragments	(rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
{
	DE_ASSERT((int)m_unitTypes.size() == m_numUnits);
	DE_ASSERT((int)m_transformations.size() == m_numUnits);
	DE_ASSERT((int)m_lodDerivateParts.size() == m_numUnits);

	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
	{
		rr::FragmentPacket& packet				= packets[packetNdx];
		const float			colorMultiplier		= 1.0f / (float)m_numUnits;
		Vec4				outColors[4]		= { Vec4(0.0f), Vec4(0.0f), Vec4(0.0f), Vec4(0.0f) };

		for (int unitNdx = 0; unitNdx < m_numUnits; unitNdx++)
		{
			tcu::Vec4 texSamples[4];

			// Read tex coords
			const tcu::Vec2 texCoords[4] =
			{
				rr::readTriangleVarying<float>(packet, context, 0, 0).xy(),
				rr::readTriangleVarying<float>(packet, context, 0, 1).xy(),
				rr::readTriangleVarying<float>(packet, context, 0, 2).xy(),
				rr::readTriangleVarying<float>(packet, context, 0, 3).xy(),
			};

			// Transform
			tcu::Vec3 coords3D[4] =
			{
				(m_transformations[unitNdx] * Vec4(texCoords[0].x(), texCoords[0].y(), 1.0f, 1.0f)).xyz(),
				(m_transformations[unitNdx] * Vec4(texCoords[1].x(), texCoords[1].y(), 1.0f, 1.0f)).xyz(),
				(m_transformations[unitNdx] * Vec4(texCoords[2].x(), texCoords[2].y(), 1.0f, 1.0f)).xyz(),
				(m_transformations[unitNdx] * Vec4(texCoords[3].x(), texCoords[3].y(), 1.0f, 1.0f)).xyz(),
			};

			// To 2D
			const tcu::Vec2 coords2D[4] =
			{
				coords3D[0].xy(),
				coords3D[1].xy(),
				coords3D[2].xy(),
				coords3D[3].xy(),
			};

			// Sample
			switch (m_unitTypes[unitNdx])
			{
				case GL_TEXTURE_2D:			m_uniforms[4*unitNdx].sampler.tex2D->sample4(texSamples, coords2D);			break;
				case GL_TEXTURE_CUBE_MAP:	m_uniforms[4*unitNdx].sampler.texCube->sample4(texSamples, coords3D);		break;
				case GL_TEXTURE_2D_ARRAY:	m_uniforms[4*unitNdx].sampler.tex2DArray->sample4(texSamples, coords3D);	break;
				case GL_TEXTURE_3D:			m_uniforms[4*unitNdx].sampler.tex3D->sample4(texSamples, coords3D);			break;
				default:
					DE_ASSERT(DE_FALSE);
			}

			// Add to sum
			for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
				outColors[fragNdx] += colorMultiplier * (texSamples[fragNdx]*m_texScales[unitNdx] + m_texBiases[unitNdx]);
		}

		// output
		for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
			rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, outColors[fragNdx]);
	}
}